

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spirv_cross_parsed_ir.cpp
# Opt level: O2

Bitset * __thiscall
diligent_spirv_cross::ParsedIR::get_member_decoration_bitset
          (ParsedIR *this,TypeID id,uint32_t index)

{
  Meta *pMVar1;
  Bitset *pBVar2;
  
  pMVar1 = find_meta(this,(ID)id.id);
  if ((pMVar1 == (Meta *)0x0) ||
     ((pMVar1->members).super_VectorView<diligent_spirv_cross::Meta::Decoration>.buffer_size <=
      (ulong)index)) {
    pBVar2 = &this->cleared_bitset;
  }
  else {
    pBVar2 = &(pMVar1->members).super_VectorView<diligent_spirv_cross::Meta::Decoration>.ptr[index].
              decoration_flags;
  }
  return pBVar2;
}

Assistant:

const Bitset &ParsedIR::get_member_decoration_bitset(TypeID id, uint32_t index) const
{
	auto *m = find_meta(id);
	if (m)
	{
		if (index >= m->members.size())
			return cleared_bitset;
		return m->members[index].decoration_flags;
	}
	else
		return cleared_bitset;
}